

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniFile.cpp
# Opt level: O2

String * __thiscall
asl::IniFile::operator[](String *__return_storage_ptr__,IniFile *this,String *name)

{
  bool bVar1;
  int j;
  Map<asl::String,_asl::String> *pMVar2;
  String *pSVar3;
  String sec;
  String local_40;
  
  j = String::indexOf(name,'/',0);
  if (j < 0) {
    pMVar2 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&this->_currentTitle)->
              super_Map<asl::String,_asl::String>;
    bVar1 = Map<asl::String,_asl::String>::has(pMVar2,name);
    if (bVar1) {
      pMVar2 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                          ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&this->_currentTitle)->
                super_Map<asl::String,_asl::String>;
      pSVar3 = Map<asl::String,_asl::String>::operator[](pMVar2,name);
      String::String(__return_storage_ptr__,pSVar3);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->field_2)._space[0] = '\0';
    __return_storage_ptr__->_size = 0;
    __return_storage_ptr__->_len = 0;
    return __return_storage_ptr__;
  }
  String::substring(&sec,name,0,j);
  bVar1 = Map<asl::String,_asl::Dic<asl::String>_>::has
                    ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&sec);
  if (bVar1) {
    pMVar2 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&sec)->
              super_Map<asl::String,_asl::String>;
    String::substring(&local_40,name,j + 1);
    String::operator=(&sec,&local_40);
    String::~String(&local_40);
    bVar1 = Map<asl::String,_asl::String>::has(pMVar2,&sec);
    if (bVar1) {
      pSVar3 = Map<asl::String,_asl::String>::operator[](pMVar2,&sec);
      String::String(__return_storage_ptr__,pSVar3);
      goto LAB_00134158;
    }
  }
  (__return_storage_ptr__->field_2)._space[0] = '\0';
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_len = 0;
LAB_00134158:
  String::~String(&sec);
  return __return_storage_ptr__;
}

Assistant:

const String IniFile::operator[](const String& name) const
{
	int slash = name.indexOf('/');
	if (slash < 0)
	{
		return _sections[_currentTitle].has(name) ? _sections[_currentTitle][name] : String();
	}
	else
	{
		String sec = name.substring(0, slash);
		if (!_sections.has(sec))
			return String();
		const Section& section = _sections[sec];
		sec = name.substring(slash + 1);
		return section.has(sec) ? section[sec] : String();
	}
}